

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form1_BitwiseXor(BitwiseXorForm1 BitwiseXor)

{
  bool bVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  code *in_RDI;
  Image output;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  uint32_t in_stack_ffffffffffffff3c;
  uint8_t value;
  undefined8 in_stack_ffffffffffffff40;
  undefined2 uVar4;
  Image *image;
  uint32_t in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4c;
  undefined1 in_stack_ffffffffffffff4d;
  undefined1 in_stack_ffffffffffffff4e;
  byte bVar5;
  undefined1 in_stack_ffffffffffffff4f;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff50;
  ImageTemplate<unsigned_char> *image1;
  undefined1 local_98 [96];
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_38;
  Image *in_stack_ffffffffffffffe0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffe8;
  
  uVar4 = (undefined2)((ulong)in_stack_ffffffffffffff40 >> 0x30);
  Unit_Test::intensityArray(in_stack_ffffffffffffff3c);
  value = (uint8_t)(in_stack_ffffffffffffff3c >> 0x18);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff50,
             CONCAT13(in_stack_ffffffffffffff4f,
                      CONCAT12(in_stack_ffffffffffffff4e,
                               CONCAT11(in_stack_ffffffffffffff4d,in_stack_ffffffffffffff4c))),
             in_stack_ffffffffffffff48,(uint8_t)((ushort)uVar4 >> 8),(uint8_t)uVar4);
  Test_Helper::uniformImages(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1cfe40);
  image1 = (ImageTemplate<unsigned_char> *)&local_38;
  pvVar2 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                         *)image1,0);
  pvVar3 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                         *)image1,1);
  (*in_RDI)(local_98,pvVar2,pvVar3);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::operator[](&local_38,0);
  bVar1 = Unit_Test::equalSize<PenguinV_Image::ImageTemplate<unsigned_char>>
                    (image1,(ImageTemplate<unsigned_char> *)
                            CONCAT17(in_stack_ffffffffffffff4f,
                                     CONCAT16(in_stack_ffffffffffffff4e,
                                              CONCAT15(in_stack_ffffffffffffff4d,
                                                       CONCAT14(in_stack_ffffffffffffff4c,
                                                                in_stack_ffffffffffffff48)))));
  bVar5 = false;
  if (bVar1) {
    image = (Image *)&stack0xffffffffffffffe0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image,0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image,1);
    bVar5 = Unit_Test::verifyImage(image,value);
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1cff27);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)image1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image1);
  return (bool)(bVar5 & 1);
}

Assistant:

bool form1_BitwiseXor(BitwiseXorForm1 BitwiseXor)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const std::vector < PenguinV_Image::Image > input = uniformImages( intensity );

        const PenguinV_Image::Image output = BitwiseXor( input[0], input[1] );

        return equalSize( input[0], output ) && verifyImage( output, intensity[0] ^ intensity[1] );
    }